

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed.cpp
# Opt level: O3

void __thiscall
iu_TypedTest_x_iutest_x_Equal_Test<short>::Body(iu_TypedTest_x_iutest_x_Equal_Test<short> *this)

{
  short *in_R9;
  TypeParam_conflict1 a;
  AssertionResult iutest_ar;
  allocator<char> local_1eb;
  undefined2 local_1ea;
  AssertionResult local_1e8;
  AssertionHelper local_1c0;
  undefined1 local_190 [392];
  
  local_1ea = 0;
  local_190._0_4_ = 0;
  iutest::internal::CmpHelperEQ<int,short>
            (&local_1e8,(internal *)0x1fd750,"a",local_190,(int *)&local_1ea,in_R9);
  if (local_1e8.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,local_1e8.m_message._M_dataplus._M_p,&local_1eb);
    local_1c0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/typed.cpp";
    local_1c0.m_part_result.super_iuCodeMessage.m_line = 0x1e;
    local_1c0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1c0,(Fixed *)local_190,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1c0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1c0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_message._M_dataplus._M_p != &local_1e8.m_message.field_2) {
    operator_delete(local_1e8.m_message._M_dataplus._M_p,
                    local_1e8.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedTest, Equal)
{
    TypeParam a = 0;
    IUTEST_ASSERT_EQ(0, a);
}